

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O1

int __thiscall APowerInvisibility::AlterWeaponSprite(APowerInvisibility *this,visstyle_t *vis)

{
  uint uVar1;
  AInventory *pAVar2;
  int iVar3;
  FRenderStyle *pFVar4;
  float fVar5;
  float fVar6;
  
  pAVar2 = (this->super_APowerup).super_AInventory.super_AActor.Inventory.field_0.p;
  iVar3 = 0;
  if (pAVar2 != (AInventory *)0x0) {
    if ((*(byte *)((long)&(pAVar2->super_AActor).super_DThinker + 0x20) & 0x20) == 0) {
      pAVar2 = (this->super_APowerup).super_AInventory.super_AActor.Inventory.field_0.p;
      iVar3 = (**(code **)(*(long *)&(pAVar2->super_AActor).super_DThinker + 0x170))(pAVar2,vis);
    }
    else {
      (this->super_APowerup).super_AInventory.super_AActor.Inventory.field_0.p = (AInventory *)0x0;
    }
  }
  if (iVar3 == 1) {
    fVar5 = (float)((double)((this->super_APowerup).super_AInventory.super_AActor.special1 + 1) *
                   ((this->super_APowerup).Strength / -100.0)) + 1.0;
    fVar6 = 1.0;
    if (fVar5 <= 1.0) {
      fVar6 = fVar5;
    }
    vis->Alpha = (float)(-(uint)(0.0 < fVar5) & (uint)fVar6);
    switch((this->super_APowerup).Mode.super_FName.Index) {
    case 0x13:
      pFVar4 = LegacyRenderStyles + 7;
      break;
    default:
      pFVar4 = LegacyRenderStyles + 6;
      break;
    case 0x15:
      pFVar4 = LegacyRenderStyles + 4;
      break;
    case 0x16:
      pFVar4 = LegacyRenderStyles + 1;
      break;
    case 0x17:
      pFVar4 = LegacyRenderStyles + 5;
      break;
    case 0x18:
      pFVar4 = LegacyRenderStyles + 0xc;
      break;
    case 0x1f:
      pFVar4 = LegacyRenderStyles + 9;
    }
    vis->RenderStyle = *pFVar4;
  }
  else if ((iVar3 == 0) &&
          (uVar1 = *(uint *)&(this->super_APowerup).super_AInventory.field_0x4fc,
          (char)((uVar1 & 8) >> 3) == '\0' && (int)uVar1 < 0x80)) {
    vis->RenderStyle = LegacyRenderStyles[1];
    vis->Alpha = 1.0;
    return 1;
  }
  fVar6 = vis->Alpha;
  if (((fVar6 == 0.0) && (!NAN(fVar6))) ||
     (fVar6 < 0.25 && 0 < (this->super_APowerup).super_AInventory.super_AActor.special1)) {
    fVar5 = (float)((this->super_APowerup).Strength / -100.0) + 1.0;
    fVar6 = 1.0;
    if (fVar5 <= 1.0) {
      fVar6 = fVar5;
    }
    vis->Alpha = (float)(-(uint)(0.0 < fVar5) & (uint)fVar6);
    vis->colormap = (SpecialColormaps.Array)->Colormap;
  }
  return -1;
}

Assistant:

int APowerInvisibility::AlterWeaponSprite (visstyle_t *vis)
{
	int changed = Inventory == NULL ? false : Inventory->AlterWeaponSprite(vis);
	// Blink if the powerup is wearing off
	if (changed == 0 && EffectTics < 4*32 && !(EffectTics & 8))
	{
		vis->RenderStyle = STYLE_Normal;
		vis->Alpha = 1.f;
		return 1;
	}
	else if (changed == 1)
	{
		// something else set the weapon sprite back to opaque but this item is still active.
		float ts = float((Strength / 100) * (special1 + 1));
		vis->Alpha = clamp<>((1.f - ts), 0.f, 1.f);
		switch (Mode)
		{
		case (NAME_Fuzzy):
			vis->RenderStyle = STYLE_OptFuzzy;
			break;
		case (NAME_Opaque):
			vis->RenderStyle = STYLE_Normal;
			break;
		case (NAME_Additive):
			vis->RenderStyle = STYLE_Add;
			break;
		case (NAME_Stencil):
			vis->RenderStyle = STYLE_Stencil;
			break;
		case (NAME_TranslucentStencil) :
			vis->RenderStyle = STYLE_TranslucentStencil;
			break;
		case (NAME_AddStencil) :
			vis->RenderStyle = STYLE_AddStencil;
			break;
		case (NAME_None) :
		case (NAME_Cumulative):
		case (NAME_Translucent):
		default:
			vis->RenderStyle = STYLE_Translucent;
			break;
		}
	}
	// Handling of Strife-like cumulative invisibility powerups, the weapon itself shouldn't become invisible
	if ((vis->Alpha < 0.25f && special1 > 0) || (vis->Alpha == 0))
	{
		vis->Alpha = clamp((1.f - float(Strength/100)), 0.f, 1.f);
		vis->colormap = SpecialColormaps[INVERSECOLORMAP].Colormap;
	}
	return -1;	// This item is valid so another one shouldn't reset the translucency
}